

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O1

CMimeAddress_T * cmime_address_new(void)

{
  CMimeAddress_T *pCVar1;
  
  pCVar1 = (CMimeAddress_T *)calloc(1,0x18);
  pCVar1->parsed = 0;
  pCVar1->name = (char *)0x0;
  pCVar1->email = (char *)0x0;
  return pCVar1;
}

Assistant:

CMimeAddress_T *cmime_address_new(void) {
    CMimeAddress_T *ca;
    ca = (CMimeAddress_T *)calloc((size_t)1,sizeof(CMimeAddress_T));
    ca->name = NULL;
    ca->email = NULL;
    ca->parsed = 0;
    return(ca);
}